

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_Token_Test::TestBody(InterpreterTestSuite_PC_Token_Test *this)

{
  long *plVar1;
  element_type *peVar2;
  bool bVar3;
  TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *this_00;
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *pTVar4;
  TypedExpectation<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *this_01;
  CommissionerAppMock *pCVar5;
  char *message;
  char *in_R9;
  initializer_list<unsigned_char> __l;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  allocator local_292;
  allocator local_291;
  undefined1 local_290 [32];
  undefined1 local_270 [8];
  _Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
  local_268;
  _Rb_tree_color local_228 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  Expression expr;
  ErrorCode local_1fc;
  ByteArray token;
  Value value;
  undefined1 local_198 [16];
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  pointer local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
  value.mError.mCode = kNone;
  value.mError.mMessage._M_string_length = 0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  value.mError.mMessage.field_2._M_local_buf[0] = '\0';
  value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
  value.mData._M_string_length = 0;
  value.mData.field_2._M_local_buf[0] = '\0';
  local_270._0_4_ = 0x61333231;
  local_270._4_2_ = 0x6665;
  __l._M_len = 6;
  __l._M_array = local_270;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&token,__l,(allocator_type *)&gtest_ar_);
  peVar2 = ctx.mDefaultCommissionerObject.
           super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  testing::A<std::__cxx11::string_const&>();
  testing::A<unsigned_short>();
  CommissionerAppMock::gmock_RequestToken
            ((MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              *)local_270,peVar2,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_290,(Matcher<unsigned_short> *)&gtest_ar);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
            ::InternalExpectedAt
                      ((MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        *)local_270,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x4b1,"*ctx.mDefaultCommissionerObject","RequestToken(_, _)");
  local_170._0_4_ = kNone;
  local_168._M_p = (pointer)&local_158;
  local_160 = (pointer)0x0;
  local_158._M_local_buf[0] = '\0';
  testing::Return<ot::commissioner::Error>((testing *)local_228,(Error *)local_170);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              *)&gtest_ar_,(ReturnAction *)local_228);
  pCVar5 = (CommissionerAppMock *)&gtest_ar_;
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  ::WillOnce(this_00,(Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                      *)pCVar5);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_220);
  std::__cxx11::string::~string((string *)&local_168);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                  *)(local_270 + 8));
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)local_290);
  gtest_ar_._0_8_ =
       CommissionerAppMock::gmock_GetToken
                 ((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                  ctx.mDefaultCommissionerObject.
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,pCVar5)
  ;
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           InternalExpectedAt((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>
                               *)&gtest_ar_,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0x4b2,"*ctx.mDefaultCommissionerObject","GetToken()");
  local_290._0_8_ = &token;
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
             local_270,(ReturnRefAction *)local_290);
  testing::internal::
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::WillOnce
            (pTVar4,(Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                    local_270);
  std::_Function_base::~_Function_base((_Function_base *)local_270);
  std::__cxx11::string::string
            ((string *)local_270,"token request 127.0.0.1 2001",(allocator *)local_290);
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_270);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&gtest_ar_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_270);
  ot::commissioner::Interpreter::Eval((Value *)local_270,&ctx.mInterpreter,&expr);
  pCVar5 = (CommissionerAppMock *)local_270;
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_270);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_270);
  bVar3 = ot::commissioner::Interpreter::Value::HasNoError(&value);
  gtest_ar_.success_ = bVar3;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4b6,(char *)CONCAT26(local_270._6_2_,CONCAT24(local_270._4_2_,local_270._0_4_)));
    pCVar5 = (CommissionerAppMock *)local_290;
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)pCVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)local_270);
    if ((_Base_ptr)local_290._0_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_290._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ =
       CommissionerAppMock::gmock_GetToken
                 ((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                  ctx.mDefaultCommissionerObject.
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,pCVar5)
  ;
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           InternalExpectedAt((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>
                               *)&gtest_ar_,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0x4b8,"*ctx.mDefaultCommissionerObject","GetToken()");
  local_290._0_8_ = &token;
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
             local_270,(ReturnRefAction *)local_290);
  testing::internal::
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::WillOnce
            (pTVar4,(Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                    local_270);
  std::_Function_base::~_Function_base((_Function_base *)local_270);
  std::__cxx11::string::string((string *)local_270,"token print",(allocator *)local_290);
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_270);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&gtest_ar_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_270);
  ot::commissioner::Interpreter::Eval((Value *)local_270,&ctx.mInterpreter,&expr);
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_270);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_270);
  bVar3 = ot::commissioner::Interpreter::Value::HasNoError(&value);
  gtest_ar_.success_ = bVar3;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4bb,(char *)CONCAT26(local_270._6_2_,CONCAT24(local_270._4_2_,local_270._0_4_)));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)local_270);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(_func_int **)local_290._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&gtest_ar_,"123aef",&local_291);
  std::__cxx11::string::string((string *)local_290,"./tmp/token",&local_292);
  ot::commissioner::WriteFile((Error *)local_270,(string *)&gtest_ar_,(string *)local_290);
  local_228[0] = local_270._0_4_;
  local_1fc = kNone;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,"WriteFile(\"123aef\", \"./tmp/token\").GetCode()",
             "ErrorCode::kNone",local_228,&local_1fc);
  std::__cxx11::string::~string((string *)(local_270 + 8));
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_270);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4bd,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    plVar1 = (long *)CONCAT26(local_270._6_2_,CONCAT24(local_270._4_2_,local_270._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  peVar2 = ctx.mDefaultCommissionerObject.
           super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  testing::A<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>();
  CommissionerAppMock::gmock_SetToken
            ((MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
              *)local_270,peVar2,
             (Matcher<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *)
             local_290);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                        *)local_270,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x4be,"*ctx.mDefaultCommissionerObject","SetToken(_)");
  local_198._0_4_ = 0;
  local_198._8_8_ = &local_180;
  local_188._M_p = (pointer)0x0;
  local_180._M_local_buf[0] = '\0';
  testing::Return<ot::commissioner::Error>((testing *)&gtest_ar,(Error *)local_198);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
              *)&gtest_ar_,(ReturnAction *)&gtest_ar);
  pCVar5 = (CommissionerAppMock *)&gtest_ar_;
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::WillOnce(this_01,(Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                      *)pCVar5);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)(local_198 + 8));
  testing::internal::MatcherBase<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *)
                 (local_270 + 8));
  testing::internal::MatcherBase<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *)
                 local_290);
  gtest_ar_._0_8_ =
       CommissionerAppMock::gmock_GetToken
                 ((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                  ctx.mDefaultCommissionerObject.
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,pCVar5)
  ;
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           InternalExpectedAt((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>
                               *)&gtest_ar_,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0x4bf,"*ctx.mDefaultCommissionerObject","GetToken()");
  local_290._0_8_ = &token;
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
             local_270,(ReturnRefAction *)local_290);
  testing::internal::
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::WillOnce
            (pTVar4,(Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                    local_270);
  std::_Function_base::~_Function_base((_Function_base *)local_270);
  std::__cxx11::string::string((string *)local_270,"token set ./tmp/token",(allocator *)local_290);
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_270);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&gtest_ar_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_270);
  ot::commissioner::Interpreter::Eval((Value *)local_270,&ctx.mInterpreter,&expr);
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_270);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_270);
  bVar3 = ot::commissioner::Interpreter::Value::HasNoError(&value);
  gtest_ar_.success_ = bVar3;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4c2,(char *)CONCAT26(local_270._6_2_,CONCAT24(local_270._4_2_,local_270._0_4_)));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)local_270);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(_func_int **)local_290._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ot::commissioner::Interpreter::Value::~Value(&value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expr);
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Token)
{
    TestContext ctx;
    InitContext(ctx);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    const ByteArray token = {'1', '2', '3', 'a', 'e', 'f'};

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, RequestToken(_, _)).WillOnce(Return(Error{}));
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetToken()).WillOnce(ReturnRef(token));

    expr  = ctx.mInterpreter.ParseExpression("token request 127.0.0.1 2001");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetToken()).WillOnce(ReturnRef(token));
    expr  = ctx.mInterpreter.ParseExpression("token print");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_EQ(WriteFile("123aef", "./tmp/token").GetCode(), ErrorCode::kNone);
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, SetToken(_)).WillOnce(Return(Error{}));
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetToken()).WillOnce(ReturnRef(token));
    expr  = ctx.mInterpreter.ParseExpression("token set ./tmp/token");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}